

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O2

void __thiscall
asio::detail::conditionally_enabled_mutex::scoped_lock::scoped_lock
          (scoped_lock *this,conditionally_enabled_mutex *m)

{
  bool bVar1;
  
  this->mutex_ = m;
  bVar1 = m->enabled_ == true;
  if (bVar1) {
    pthread_mutex_lock((pthread_mutex_t *)&m->mutex_);
  }
  this->locked_ = bVar1;
  return;
}

Assistant:

explicit scoped_lock(conditionally_enabled_mutex& m)
      : mutex_(m)
    {
      if (m.enabled_)
      {
        mutex_.mutex_.lock();
        locked_ = true;
      }
      else
        locked_ = false;
    }